

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

FeatureMask
spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::get_feature_dependency_mask(Feature feature)

{
  FeatureMask FVar1;
  FeatureVector FStack_48;
  
  get_feature_dependencies(&FStack_48,feature);
  FVar1 = build_mask(&FStack_48);
  SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>::~SmallVector
            (&FStack_48);
  return FVar1;
}

Assistant:

CompilerGLSL::ShaderSubgroupSupportHelper::FeatureMask
CompilerGLSL::ShaderSubgroupSupportHelper::get_feature_dependency_mask(Feature feature)
{
	return build_mask(get_feature_dependencies(feature));
}